

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O1

char * Ses_ManFindMinimumSize(Ses_Man_t *pSes)

{
  int *piVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  char *pcVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  char *local_30;
  
  iVar4 = pSes->nSpecFunc;
  if (iVar4 < 2) {
    uVar9 = pSes->nMaxDepth;
    uVar5 = (ulong)uVar9;
    if ((uVar9 != 0xffffffff) && (piVar1 = pSes->pArrTimeProfile, piVar1 != (int *)0x0)) {
      pSes->vStairDecVars->nSize = 0;
      pSes->fDecStructure = 0;
      iVar14 = pSes->nSpecVars;
      if (0 < (long)iVar14) {
        lVar8 = 0;
        do {
          uVar10 = piVar1[lVar8];
          uVar13 = (ulong)uVar10;
          if ((int)uVar9 <= (int)uVar10) {
            if (pSes->fReasonVerbose == 0) goto LAB_002bc51d;
            pcVar7 = 
            "give up due to impossible arrival time (depth = %d, input = %d, arrival time = %d)";
            goto LAB_002bc9fe;
          }
          if ((iVar4 == 1) && (uVar10 + 1 == uVar9)) {
            iVar12 = pSes->fDecStructure;
            if ((iVar12 == 2) || (2 < iVar14 && iVar12 == 1)) {
              if (pSes->fReasonVerbose == 0) goto LAB_002bc51d;
              pcVar7 = 
              "give up due to impossible decomposition (depth = %d, input = %d, arrival time = %d)";
              goto LAB_002bc9fe;
            }
            pSes->fDecStructure = iVar12 + 1;
            if (((uint)pSes->pDecVars >> ((uint)lVar8 & 0x1f) & 1) == 0) {
              if (pSes->fReasonVerbose == 0) goto LAB_002bc51d;
              uVar13 = (ulong)(uint)piVar1[lVar8];
              pcVar7 = 
              "give up due to impossible decomposition (depth = %d, input = %d, arrival time = %d)";
              goto LAB_002bc9fe;
            }
          }
          lVar8 = lVar8 + 1;
        } while (iVar14 != lVar8);
      }
      if (pSes->fDecStructure != 0) {
        uVar5 = 1;
        do {
          uVar13 = uVar5;
          uVar5 = (ulong)(uint)pSes->nSpecVars;
          if (pSes->nSpecVars < 1) break;
          iVar4 = (int)uVar13;
          lVar8 = 0;
          iVar14 = 0;
          do {
            if (pSes->pArrTimeProfile[lVar8] + iVar4 == pSes->nMaxDepth) {
              if (iVar14 == 0) {
                Vec_IntPush(pSes->vStairDecVars,(int)lVar8);
              }
              else {
                if (iVar4 != pSes->vStairDecVars->nSize) {
                  __assert_fail("nLevel == Vec_IntSize( pSes->vStairDecVars )",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                                ,0x806,"int Ses_CheckDepthConsistency(Ses_Man_t *)");
                }
                if ((1 < iVar14) || ((int)(iVar4 + 1U) < (int)uVar5)) {
                  if (pSes->fReasonVerbose != 0) {
                    printf("give up due to impossible decomposition at level %d",uVar13);
                    return (char *)0x0;
                  }
                  goto LAB_002bc51d;
                }
              }
              iVar14 = iVar14 + 1;
            }
            lVar8 = lVar8 + 1;
            uVar5 = (ulong)pSes->nSpecVars;
          } while (lVar8 < (long)uVar5);
          uVar5 = (ulong)(iVar4 + 1U);
        } while (iVar14 != 0);
        iVar4 = pSes->vStairDecVars->nSize;
        if ((iVar4 != 0) &&
           (iVar4 = Abc_TtIsStairDecomposable
                              (pSes->pSpec,pSes->nSpecWords,pSes->vStairDecVars->pArray,iVar4,
                               pSes->pStairDecFunc), iVar4 == 0)) {
          if (pSes->fReasonVerbose != 0) {
            printf("give up due to impossible stair decomposition at level %d: ",uVar13);
            Vec_IntPrint(pSes->vStairDecVars);
            return (char *)0x0;
          }
          goto LAB_002bc51d;
        }
      }
      lVar6 = (long)pSes->nSpecVars;
      iVar4 = (lVar6 == 4) + 3;
      if (pSes->fDecStructure != 0) {
        iVar4 = (lVar6 == 3) + 1;
      }
      uVar9 = 0;
      if (0 < lVar6) {
        uVar5 = (ulong)(uint)pSes->nMaxDepth;
        lVar8 = 0;
        do {
          uVar13 = (ulong)(uint)pSes->pArrTimeProfile[lVar8];
          if (pSes->pArrTimeProfile[lVar8] + 2U == pSes->nMaxDepth) {
            if (iVar4 <= (int)uVar9) {
              if (pSes->fReasonVerbose == 0) goto LAB_002bc51d;
              pcVar7 = 
              "give up due to impossible decomposition at second level (depth = %d, input = %d, arrival time = %d)"
              ;
              goto LAB_002bc9fe;
            }
            uVar9 = uVar9 + 1;
          }
          lVar8 = lVar8 + 1;
        } while (lVar6 != lVar8);
        uVar9 = (uint)(uVar9 == 1);
      }
      if (((pSes->fDecStructure != 0 && 4 < pSes->nSpecVars) & (byte)uVar9) == 1) {
        uVar5 = (ulong)(uint)pSes->nMaxDepth;
        lVar8 = 0;
        bVar2 = false;
        do {
          uVar13 = (ulong)(uint)pSes->pArrTimeProfile[lVar8];
          bVar3 = bVar2;
          if ((pSes->pArrTimeProfile[lVar8] + 3U == pSes->nMaxDepth) && (bVar3 = true, bVar2)) {
            if (pSes->fReasonVerbose != 0) {
              pcVar7 = 
              "give up due to impossible decomposition at third level (depth = %d, input = %d, arrival time = %d)"
              ;
LAB_002bc9fe:
              printf(pcVar7,uVar5,lVar8,uVar13);
              return (char *)0x0;
            }
            goto LAB_002bc51d;
          }
          bVar2 = bVar3;
          lVar8 = lVar8 + 1;
        } while (lVar6 != lVar8);
      }
      uVar9 = pSes->nSpecVars;
      iVar4 = pSes->nMaxDepth;
      pSes->nMaxGates = 0;
      if (0 < (int)uVar9 && iVar4 != 0) {
        uVar5 = (ulong)uVar9;
        iVar14 = 1;
        iVar12 = 0;
        do {
          uVar13 = 0;
          do {
            iVar11 = iVar14;
            uVar10 = uVar9;
            uVar9 = (uint)(pSes->pArrTimeProfile[uVar13] == iVar4);
            iVar14 = iVar11 - uVar9;
            uVar9 = uVar10 - uVar9;
            uVar13 = uVar13 + 1;
          } while (uVar5 != uVar13);
          iVar12 = iVar12 + iVar14;
          pSes->nMaxGates = iVar12;
        } while (((iVar14 != 0) && (iVar4 = iVar4 + -1, iVar4 != 0)) &&
                (iVar14 = iVar14 * 2, iVar11 < (int)uVar10));
      }
    }
    uVar9 = pSes->nStartGates;
    local_30 = (char *)0x0;
    pSes->fHitResLimit = 0;
    pSes->nDebugOffset = 9 < pSes->nMaxGates | 2;
    iVar4 = pSes->vStairDecVars->nSize;
    uVar10 = iVar4 - 1;
    if ((int)uVar10 < (int)uVar9) {
      uVar10 = uVar9;
    }
    if (iVar4 == 0) {
      uVar10 = uVar9;
    }
    uVar5 = (ulong)uVar10;
    pSes->pTtValues[2] = 0;
    pSes->pTtValues[3] = 0;
    pSes->pTtValues[0] = 0;
    pSes->pTtValues[1] = 0;
    if (pSes->fVeryVerbose != 0) {
      printf(" (%d/%d)",uVar5);
      fflush(_stdout);
    }
    do {
      iVar4 = (int)uVar5;
      uVar9 = iVar4 + 1;
      uVar5 = (ulong)uVar9;
      uVar9 = Ses_ManFindNetworkExactCEGAR(pSes,uVar9,&local_30);
      if (uVar9 == 0) {
        pSes->fHitResLimit = 1;
        break;
      }
    } while ((uVar9 & 1) == 0);
    if (pSes->fVeryVerbose != 0) {
      iVar4 = pSes->nDebugOffset + (uint)(8 < iVar4) + 4;
      if (0 < iVar4) {
        do {
          putchar(8);
          iVar4 = iVar4 + -1;
        } while (iVar4 != 0);
      }
      fflush(_stdout);
    }
    pcVar7 = local_30;
    if (((local_30 == (char *)0x0) && (pSes->nMaxDepth != -1)) && (pSes->fHitResLimit != 0)) {
      uVar9 = pSes->nGates;
      uVar10 = pSes->nMaxGates;
      if (uVar9 != uVar10) {
        local_30 = (char *)0x0;
        pSes->fHitResLimit = 0;
        if (pSes->fVeryVerbose != 0) {
          printf(" (%d/%d)",(ulong)uVar10,(ulong)uVar10);
          fflush(_stdout);
        }
        uVar9 = uVar9 + 1;
        pcVar7 = (char *)0x0;
        while (iVar4 = Ses_ManFindNetworkExactCEGAR(pSes,uVar10,&local_30), iVar4 == 1) {
          pcVar7 = local_30;
          if (uVar9 == uVar10) goto LAB_002bc9ab;
          uVar10 = uVar10 - 1;
        }
        uVar9 = uVar10;
        if (iVar4 == 0) {
          pSes->fHitResLimit = 1;
        }
LAB_002bc9ab:
        if (pSes->fVeryVerbose != 0) {
          iVar4 = pSes->nDebugOffset + (uint)(9 < (int)uVar9) + 4;
          if (0 < iVar4) {
            do {
              putchar(8);
              iVar4 = iVar4 + -1;
            } while (iVar4 != 0);
          }
          fflush(_stdout);
        }
      }
    }
  }
  else {
    uVar9 = pSes->nStartGates;
    do {
      uVar9 = uVar9 + 1;
      if (pSes->fVerbose != 0) {
        printf("try with %d gates\n",(ulong)uVar9);
      }
      *(undefined4 *)(pSes->pTtValues + 2) = 0xffffffff;
      *(undefined4 *)((long)pSes->pTtValues + 0x14) = 0xffffffff;
      *(undefined4 *)(pSes->pTtValues + 3) = 0xffffffff;
      *(undefined4 *)((long)pSes->pTtValues + 0x1c) = 0xffffffff;
      *(undefined4 *)pSes->pTtValues = 0xffffffff;
      *(undefined4 *)((long)pSes->pTtValues + 4) = 0xffffffff;
      *(undefined4 *)(pSes->pTtValues + 1) = 0xffffffff;
      *(undefined4 *)((long)pSes->pTtValues + 0xc) = 0xffffffff;
      iVar4 = Ses_ManFindNetworkExact(pSes,uVar9);
    } while (iVar4 == 2);
    if (iVar4 != 0) {
      pcVar7 = Ses_ManExtractSolution(pSes);
      return pcVar7;
    }
LAB_002bc51d:
    pcVar7 = (char *)0x0;
  }
  return pcVar7;
}

Assistant:

static char * Ses_ManFindMinimumSize( Ses_Man_t * pSes )
{
    char * pSol = NULL;
    int i = pSes->nStartGates + 1, fRes;

    /* if more than one function, no CEGAR */
    if ( pSes->nSpecFunc > 1 )
    {
      while ( true )
      {
        if ( pSes->fVerbose )
        {
          printf( "try with %d gates\n", i );
        }

        memset( pSes->pTtValues, ~0, 4 * sizeof( word ) );
        fRes = Ses_ManFindNetworkExact( pSes, i++ );
        if ( fRes == 2 ) continue;
        if ( fRes == 0 ) break;

        pSol = Ses_ManExtractSolution( pSes );
        break;
      }

      return pSol;
    }

    /* do the arrival times allow for a network? */
    if ( pSes->nMaxDepth != -1 && pSes->pArrTimeProfile )
    {
        if ( !Ses_CheckDepthConsistency( pSes ) )
            return 0;
        Ses_ManComputeMaxGates( pSes );
    }

    pSol = Ses_ManFindMinimumSizeBottomUp( pSes );

    if ( !pSol && pSes->nMaxDepth != -1 && pSes->fHitResLimit && pSes->nGates != pSes->nMaxGates )
        return Ses_ManFindMinimumSizeTopDown( pSes, pSes->nGates + 1 );
    else
        return pSol;
}